

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreensurface.cpp
# Opt level: O0

QSurfaceFormat __thiscall QOffscreenSurface::format(QOffscreenSurface *this)

{
  QOffscreenSurfacePrivate *pQVar1;
  QSurfaceFormatPrivate *in_RDI;
  QOffscreenSurfacePrivate *d;
  QSurfaceFormatPrivate *this_00;
  
  this_00 = in_RDI;
  pQVar1 = d_func((QOffscreenSurface *)0x3ad008);
  if (pQVar1->platformOffscreenSurface == (QPlatformOffscreenSurface *)0x0) {
    if (pQVar1->offscreenWindow == (QWindow *)0x0) {
      QSurfaceFormat::QSurfaceFormat((QSurfaceFormat *)this_00,(QSurfaceFormat *)in_RDI);
    }
    else {
      (**(code **)(*(long *)pQVar1->offscreenWindow + 0x68))(in_RDI);
    }
  }
  else {
    (*(pQVar1->platformOffscreenSurface->super_QPlatformSurface)._vptr_QPlatformSurface[2])(in_RDI);
  }
  return (QSurfaceFormat)this_00;
}

Assistant:

QSurfaceFormat QOffscreenSurface::format() const
{
    Q_D(const QOffscreenSurface);
    if (d->platformOffscreenSurface)
        return d->platformOffscreenSurface->format();
    if (d->offscreenWindow)
        return d->offscreenWindow->format();
    return d->requestedFormat;
}